

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CCallExpression *expression)

{
  CExpressionList *pCVar1;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar2;
  size_type sVar3;
  const_reference this_00;
  allocator local_e9;
  string local_e8 [32];
  ChildrenAnswers local_c8;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_98;
  undefined1 local_80 [8];
  ChildrenAnswers answers;
  int local_48;
  int i;
  CNameExpression *local_38;
  undefined1 local_30 [8];
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  CCallExpression *expression_local;
  PrintVisitor *this_local;
  
  children.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)expression;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  local_38 = CCallExpression::getFunction
                       ((CCallExpression *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::push_back
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30,
             (value_type *)&local_38);
  local_48 = 0;
  while( true ) {
    pCVar1 = CCallExpression::getArguments
                       ((CCallExpression *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar2 = CExpressionList::getExpressions(pCVar1);
    sVar3 = std::
            vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
            ::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_48) break;
    pCVar1 = CCallExpression::getArguments
                       ((CCallExpression *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar2 = CExpressionList::getExpressions(pCVar1);
    this_00 = std::
              vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
              ::operator[](pvVar2,(long)local_48);
    answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
                  get(this_00);
    std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::push_back
              ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30,
               (value_type *)
               &answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_48 = local_48 + 1;
  }
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&local_98,(vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_80,this,&local_98);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector(&local_98);
  ChildrenAnswers::ChildrenAnswers(&local_c8,(ChildrenAnswers *)local_80);
  AddChildrenAnswers(this,&local_c8);
  ChildrenAnswers::~ChildrenAnswers(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Call",&local_e9);
  AddLabel(this,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_80);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CCallExpression &expression ) {
    std::vector<const IRT::INode *> children;
    children.push_back( expression.getFunction( ));
    for ( int i = 0; i < expression.getArguments( )->getExpressions( ).size( ); ++i ) {
        children.push_back( expression.getArguments( )->getExpressions( )[ i ].get( ));
    }
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "Call" );
    ++lastVisited;
}